

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

void SQSharedState::MarkObject(SQObjectPtr *o,SQCollectable_conflict **chain)

{
  int iVar1;
  undefined8 in_RSI;
  int *in_RDI;
  
  iVar1 = *in_RDI;
  if (iVar1 == 0x8000040) {
    (**(code **)(**(long **)(in_RDI + 2) + 0x20))(*(long **)(in_RDI + 2),in_RSI);
  }
  else if (iVar1 == 0x8000100) {
    (**(code **)(**(long **)(in_RDI + 2) + 0x20))(*(long **)(in_RDI + 2),in_RSI);
  }
  else if (iVar1 == 0x8000200) {
    (**(code **)(**(long **)(in_RDI + 2) + 0x20))(*(long **)(in_RDI + 2),in_RSI);
  }
  else if (iVar1 == 0x8000400) {
    (**(code **)(**(long **)(in_RDI + 2) + 0x20))(*(long **)(in_RDI + 2),in_RSI);
  }
  else if (iVar1 == 0x8001000) {
    (**(code **)(**(long **)(in_RDI + 2) + 0x20))(*(long **)(in_RDI + 2),in_RSI);
  }
  else if (iVar1 == 0x8002000) {
    (**(code **)(**(long **)(in_RDI + 2) + 0x20))(*(long **)(in_RDI + 2),in_RSI);
  }
  else if (iVar1 == 0x8004000) {
    (**(code **)(**(long **)(in_RDI + 2) + 0x20))(*(long **)(in_RDI + 2),in_RSI);
  }
  else if (iVar1 == 0x8020000) {
    (**(code **)(**(long **)(in_RDI + 2) + 0x20))(*(long **)(in_RDI + 2),in_RSI);
  }
  else if (iVar1 == 0xa000020) {
    (**(code **)(**(long **)(in_RDI + 2) + 0x20))(*(long **)(in_RDI + 2),in_RSI);
  }
  else if (iVar1 == 0xa000080) {
    (**(code **)(**(long **)(in_RDI + 2) + 0x20))(*(long **)(in_RDI + 2),in_RSI);
  }
  else if (iVar1 == 0xa008000) {
    (**(code **)(**(long **)(in_RDI + 2) + 0x20))(*(long **)(in_RDI + 2),in_RSI);
  }
  return;
}

Assistant:

void SQSharedState::MarkObject(SQObjectPtr &o,SQCollectable **chain)
{
    switch(sq_type(o)){
    case OT_TABLE:_table(o)->Mark(chain);break;
    case OT_ARRAY:_array(o)->Mark(chain);break;
    case OT_USERDATA:_userdata(o)->Mark(chain);break;
    case OT_CLOSURE:_closure(o)->Mark(chain);break;
    case OT_NATIVECLOSURE:_nativeclosure(o)->Mark(chain);break;
    case OT_GENERATOR:_generator(o)->Mark(chain);break;
    case OT_THREAD:_thread(o)->Mark(chain);break;
    case OT_CLASS:_class(o)->Mark(chain);break;
    case OT_INSTANCE:_instance(o)->Mark(chain);break;
    case OT_OUTER:_outer(o)->Mark(chain);break;
    case OT_FUNCPROTO:_funcproto(o)->Mark(chain);break;
    default: break; //shutup compiler
    }
}